

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilProgress.c
# Opt level: O0

ProgressBar * Extra_ProgressBarStart(FILE *pFile,int nItemsTotal)

{
  int iVar1;
  Abc_Frame_t *p_00;
  ProgressBar *p;
  int nItemsTotal_local;
  FILE *pFile_local;
  
  p_00 = Abc_FrameGetGlobalFrame();
  iVar1 = Abc_FrameShowProgress(p_00);
  if (iVar1 == 0) {
    pFile_local = (FILE *)0x0;
  }
  else {
    pFile_local = (FILE *)malloc(0x18);
    memset(pFile_local,0,0x18);
    pFile_local->_IO_read_end = (char *)pFile;
    *(int *)&pFile_local->field_0x4 = nItemsTotal;
    *(int *)&pFile_local->_IO_read_ptr = 0x4e;
    *(int *)((long)&pFile_local->_IO_read_ptr + 4) = 1;
    pFile_local->_flags =
         (int)((((double)*(int *)((long)&pFile_local->_IO_read_ptr + 4) + 7.0) *
               (double)*(int *)&pFile_local->field_0x4) / (double)*(int *)&pFile_local->_IO_read_ptr
              );
    Extra_ProgressBarShow((ProgressBar *)pFile_local,(char *)0x0);
  }
  return (ProgressBar *)pFile_local;
}

Assistant:

ProgressBar * Extra_ProgressBarStart( FILE * pFile, int nItemsTotal )
{
    ProgressBar * p;
    if ( !Abc_FrameShowProgress(Abc_FrameGetGlobalFrame()) ) return NULL;
    p = ABC_ALLOC( ProgressBar, 1 );
    memset( p, 0, sizeof(ProgressBar) );
    p->pFile       = pFile;
    p->nItemsTotal = nItemsTotal;
    p->posTotal    = 78;
    p->posCur      = 1;
    p->nItemsNext  = (int)((7.0+p->posCur)*p->nItemsTotal/p->posTotal);
    Extra_ProgressBarShow( p, NULL );
    return p;
}